

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void linearize_local_statement(Proc *proc,AstNode *stmt)

{
  PtrListIterator *__return_storage_ptr__;
  LuaSymbolList *head;
  long lVar1;
  AstNodeList *expr_list;
  long lVar2;
  undefined8 proc_00;
  int nv;
  void *pvVar3;
  long *plVar4;
  undefined8 uStack_60;
  undefined1 auStack_58 [16];
  PtrListIterator symiter__;
  
  uStack_60 = 0x1199db;
  symiter__._16_8_ = proc;
  nv = raviX_ptrlist_size((PtrList *)(stmt->field_2).local_stmt.var_list);
  lVar2 = (long)nv * -0x10;
  head = (stmt->field_2).local_stmt.var_list;
  __return_storage_ptr__ = (PtrListIterator *)(auStack_58 + 8);
  *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x1199fd;
  raviX_ptrlist_forward_iterator(__return_storage_ptr__,(PtrList *)head);
  *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x119a05;
  pvVar3 = raviX_ptrlist_iter_next(__return_storage_ptr__);
  if (pvVar3 != (void *)0x0) {
    plVar4 = (long *)(auStack_58 + lVar2 + 8);
    do {
      lVar1 = *(long *)((long)pvVar3 + 0x38);
      if (lVar1 == 0) {
        *(code **)(auStack_58 + lVar2 + -8) = linearize_expression_statement;
        __assert_fail("var_pseudo",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x79c,"void linearize_local_statement(Proc *, AstNode *)");
      }
      plVar4[-1] = (long)pvVar3 + 8;
      *plVar4 = lVar1;
      *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x119a2b;
      pvVar3 = raviX_ptrlist_iter_next(__return_storage_ptr__);
      plVar4 = plVar4 + 2;
    } while (pvVar3 != (void *)0x0);
  }
  proc_00 = symiter__._16_8_;
  expr_list = (stmt->field_2).local_stmt.expr_list;
  *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x119a47;
  linearize_assignment((Proc *)proc_00,expr_list,(node_info *)(auStack_58 + lVar2),nv);
  return;
}

Assistant:

static void linearize_local_statement(Proc *proc, AstNode *stmt)
{
	LuaSymbol *sym;

	int nv = raviX_ptrlist_size((const PtrList *)stmt->local_stmt.var_list);
	struct node_info *varinfo = (struct node_info *)alloca(nv * sizeof(struct node_info));
	int i = 0;

	FOR_EACH_PTR(stmt->local_stmt.var_list, LuaSymbol, sym)
	{
		Pseudo *var_pseudo = sym->variable.pseudo;
		assert(var_pseudo);
		varinfo[i].vartype = &sym->variable.value_type;
		varinfo[i].pseudo = var_pseudo;
		i++;
	}
	END_FOR_EACH_PTR(var)

	linearize_assignment(proc, stmt->local_stmt.expr_list, varinfo, nv);
}